

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

void highbd_sse_w4x4_avx2(__m256i *sum,uint16_t *a,int a_stride,uint16_t *b,int b_stride)

{
  __m256i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(a + a_stride);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)a;
  auVar2 = vpunpcklqdq_avx(auVar4,auVar2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(a + a_stride * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(a + a_stride * 3);
  auVar4 = vpunpcklqdq_avx(auVar5,auVar8);
  auVar3._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar3._16_16_ = ZEXT116(1) * auVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(b + b_stride);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)b;
  auVar2 = vpunpcklqdq_avx(auVar9,auVar6);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(b + b_stride * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(b + b_stride * 3);
  auVar4 = vpunpcklqdq_avx(auVar10,auVar11);
  auVar7._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar7._16_16_ = ZEXT116(1) * auVar2;
  auVar3 = vpsubw_avx2(auVar3,auVar7);
  auVar3 = vpmaddwd_avx2(auVar3,auVar3);
  alVar1 = (__m256i)vpaddd_avx2(auVar3,(undefined1  [32])*sum);
  *sum = alVar1;
  return;
}

Assistant:

static inline void highbd_sse_w4x4_avx2(__m256i *sum, const uint16_t *a,
                                        int a_stride, const uint16_t *b,
                                        int b_stride) {
  const __m128i v_a0 = xx_loadl_64(a);
  const __m128i v_a1 = xx_loadl_64(a + a_stride);
  const __m128i v_a2 = xx_loadl_64(a + a_stride * 2);
  const __m128i v_a3 = xx_loadl_64(a + a_stride * 3);
  const __m128i v_b0 = xx_loadl_64(b);
  const __m128i v_b1 = xx_loadl_64(b + b_stride);
  const __m128i v_b2 = xx_loadl_64(b + b_stride * 2);
  const __m128i v_b3 = xx_loadl_64(b + b_stride * 3);
  const __m256i v_a_w = yy_set_m128i(_mm_unpacklo_epi64(v_a0, v_a1),
                                     _mm_unpacklo_epi64(v_a2, v_a3));
  const __m256i v_b_w = yy_set_m128i(_mm_unpacklo_epi64(v_b0, v_b1),
                                     _mm_unpacklo_epi64(v_b2, v_b3));
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}